

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.h
# Opt level: O0

ScopeSlots __thiscall Js::SlotArrayVariablesWalker::GetSlotArray(SlotArrayVariablesWalker *this)

{
  Type *slotArray_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long in_RSI;
  Type *slotArray;
  SlotArrayVariablesWalker *this_local;
  
  slotArray_00 = *(Type **)(in_RSI + 0x10);
  if (slotArray_00 == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/DiagObjectModel.h"
                                ,0x101,"(slotArray != nullptr)","slotArray != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ScopeSlots::ScopeSlots((ScopeSlots *)this,slotArray_00);
  return (ScopeSlots)(Type)this;
}

Assistant:

ScopeSlots GetSlotArray()
        {
            Field(Var) *slotArray = (Field(Var) *) instance;
            Assert(slotArray != nullptr);
            return ScopeSlots(slotArray);
        }